

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O3

bool test_Player_attack(void)

{
  pointer ppPVar1;
  int iVar2;
  GameLoop *pGVar3;
  
  GameLoop::start();
  pGVar3 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar3);
  pGVar3 = GameLoop::getInstance();
  ppPVar1 = (pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    iVar2 = Player::attack(*ppPVar1);
    GameLoop::resetInstance();
    return iVar2 != -1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

bool test_Player_attack() {

    // Arrange
    bool success = true;
    GameLoop::start();
    GameLoop::getInstance()->distributeArmies(); // because you need armies to attack
    if (GameLoop::getInstance()->getAllPlayers()->at(0)->attack() == PlayerAction::FAILED) {
        success = false;
    }
    GameLoop::resetInstance();
    return success;
}